

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::
format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,int *args_2,
          basic_string_view<char,_std::char_traits<char>_> *args_3,char (*args_4) [13],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
          char (*args_6) [42])

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
            ((ostream *)local_1b0,(char *)this,
             (basic_string_view<char,_std::char_traits<char>_> *)fmt,args,(int *)args_1,
             (basic_string_view<char,_std::char_traits<char>_> *)args_2,(char (*) [13])args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_4,
             (char (*) [42])args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}